

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irStatement * build_ir_stmt(Context_conflict *ctx,void *_ast)

{
  MOJOSHADER_irNode *pMVar1;
  MOJOSHADER_irNode *retval;
  void *_ast_local;
  Context_conflict *ctx_local;
  
  pMVar1 = build_ir(ctx,_ast);
  if ((pMVar1 != (MOJOSHADER_irNode *)0x0) && ((pMVar1->ir).type < MOJOSHADER_IR_MOVE)) {
    __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_STMT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x11f4,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
  }
  if ((pMVar1 != (MOJOSHADER_irNode *)0x0) && (MOJOSHADER_IR_DISCARD < (pMVar1->ir).type)) {
    __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_STMT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x11f5,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
  }
  return (MOJOSHADER_irStatement *)pMVar1;
}

Assistant:

static inline MOJOSHADER_irStatement *build_ir_stmt(Context *ctx, void *_ast)
{
    MOJOSHADER_irNode *retval = build_ir(ctx, _ast);
    assert(!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_STMT));
    assert(!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_STMT));
    return (MOJOSHADER_irStatement *) retval;
}